

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR moveto_scnode(lyxp_set *set,lys_module *moveto_mod,char *ncname,lyxp_axis axis,
                    uint32_t options)

{
  lyxp_set_type lVar1;
  lysc_node *scnode;
  char *__s;
  char *name;
  LY_ERR LVar2;
  int *piVar3;
  lysc_node *plVar4;
  lysc_node *plVar5;
  lysc_node *plVar6;
  lys_module *plVar7;
  ulong uVar8;
  size_t prefix_len;
  size_t name_len;
  ulong uVar9;
  int iVar10;
  long lVar11;
  undefined8 uVar12;
  uint getnext_opts;
  lyxp_node_type lVar13;
  ulong uVar14;
  lysc_node *plVar15;
  bool bVar16;
  lyxp_axis axis_00;
  lysc_node *iter;
  lyxp_node_type iter_type;
  char local_85;
  uint32_t mod_idx;
  lys_module *local_80;
  uint32_t idx;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  lysc_node *local_58;
  undefined8 local_50;
  lys_module *local_48;
  char *local_40;
  uint local_34;
  
  local_80 = (lys_module *)0x0;
  if ((options & 0x20) == 0) {
    lVar1 = set->type;
    local_48 = moveto_mod;
    local_40 = ncname;
    if ((ulong)lVar1 != 1) {
      if (lVar1 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
        uVar12 = *(undefined8 *)(&DAT_00204678 + (ulong)lVar1 * 8);
      }
      else {
        uVar12 = 0;
      }
      ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.",
              "path operator",uVar12);
      return LY_EVALID;
    }
    uVar8 = (ulong)set->used;
    if (uVar8 == 0) {
      bVar16 = false;
    }
    else {
      uVar14 = (ulong)axis;
      local_34 = axis - LYXP_AXIS_CHILD;
      if (axis == LYXP_AXIS_ATTRIBUTE) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x1926,"LY_ERR moveto_axis_scnode_next_in_ctx(int32_t *, enum lyxp_axis)");
      }
      getnext_opts = options >> 4 & 0x20 | options & 0x10;
      local_85 = (moveto_mod != (lys_module *)0x0 && ncname != (char *)0x0) && local_34 < 2;
      local_60 = 0;
      local_50 = 0;
      local_70 = uVar14;
      local_68 = uVar8;
      do {
        plVar4 = (lysc_node *)(local_60 * 3);
        piVar3 = (int *)((long)(set->val).nodes + local_60 * 0x18 + 0xc);
        if ((local_34 < 8) || ((uint)uVar14 < 2)) {
          if (*piVar3 == -2) {
            iVar10 = -1;
          }
          else {
            if (*piVar3 != 2) goto LAB_001b2502;
            iVar10 = 0;
          }
LAB_001b1faa:
          *piVar3 = iVar10;
          iter = (lysc_node *)0x0;
          iter_type = LYXP_NODE_NONE;
          local_58 = plVar4;
LAB_001b1fc6:
          plVar5 = iter;
          scnode = (lysc_node *)(&((set->val).nodes)->node)[(long)plVar4];
          lVar13 = (&((set->val).nodes)->type)[(long)plVar4 * 2];
          if (iter_type == LYXP_NODE_NONE) {
            LVar2 = moveto_axis_scnode_next_first
                              (&iter,&iter_type,&local_80,&mod_idx,scnode,lVar13,(lyxp_axis)uVar14,
                               set,getnext_opts);
            goto LAB_001b23fd;
          }
          plVar6 = (lysc_node *)0x0;
          plVar4 = scnode;
          plVar7 = local_80;
          switch(uVar14 & 0xffffffff) {
          case 1:
            if ((iter_type == lVar13) && (iter == scnode)) {
              axis_00 = LYXP_AXIS_ANCESTOR;
LAB_001b20d4:
              iter_type = LYXP_NODE_NONE;
              iter = (lysc_node *)0x0;
              LVar2 = moveto_axis_scnode_next_first
                                (&iter,&iter_type,&local_80,&mod_idx,scnode,lVar13,axis_00,set,
                                 getnext_opts);
              plVar4 = local_58;
              uVar14 = local_70;
              goto LAB_001b23fd;
            }
          case 0:
            if (iter_type == LYXP_NODE_ELEM) {
              if (iter == (lysc_node *)0x0) {
                plVar4 = (lysc_node *)0x0;
              }
              else {
                plVar4 = iter->parent;
              }
              plVar6 = lysc_data_node(plVar4);
              lVar13 = LYXP_NODE_ELEM;
              plVar7 = local_80;
              if (plVar6 == (lysc_node *)0x0) {
                lVar13 = set->root_type;
              }
            }
            else {
LAB_001b2346:
              plVar6 = (lysc_node *)0x0;
              plVar7 = local_80;
switchD_001b1ffc_caseD_8:
              local_80 = plVar7;
              lVar13 = LYXP_NODE_NONE;
              plVar7 = local_80;
            }
            break;
          case 2:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                          ,0x1a4a,
                          "LY_ERR moveto_axis_scnode_next(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                         );
          case 3:
          case 7:
            goto switchD_001b1ffc_caseD_3;
          case 4:
          case 6:
            goto switchD_001b1ffc_caseD_4;
          case 5:
            if ((iter_type == lVar13) && (iter == scnode)) {
              axis_00 = LYXP_AXIS_DESCENDANT;
              goto LAB_001b20d4;
            }
            if ((int)local_70 == 9) goto switchD_001b1ffc_caseD_9;
switchD_001b1ffc_caseD_4:
            plVar5 = iter;
            plVar15 = (lysc_node *)0x0;
            if ((int)local_70 != 6) {
              plVar15 = plVar4;
            }
            if (iter == (lysc_node *)0x0) {
              __assert_fail("*iter",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0x1a0a,
                            "LY_ERR moveto_axis_scnode_next(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                           );
            }
            plVar6 = lysc_node_child(iter);
            if (plVar6 == (lysc_node *)0x0) {
              if ((plVar5 != plVar15) &&
                 (plVar4 = lysc_data_node(plVar5->parent), plVar4 != (lysc_node *)0x0)) {
                plVar4 = lysc_data_node(plVar5->parent);
                plVar6 = lys_getnext(plVar5,plVar4,(lysc_module *)0x0,getnext_opts);
                goto LAB_001b21b6;
              }
LAB_001b223f:
              plVar6 = (lysc_node *)0x0;
            }
            else {
LAB_001b21b6:
              do {
                if (plVar6 != (lysc_node *)0x0) break;
                plVar5 = plVar5->parent;
                if (plVar5 == plVar15) goto LAB_001b223f;
                if (plVar5 == (lysc_node *)0x0) {
                  plVar4 = (lysc_node *)0x0;
                }
                else {
                  plVar4 = plVar5->parent;
                }
                plVar4 = lysc_data_node(plVar4);
                if (plVar4 == (lysc_node *)0x0) goto LAB_001b223f;
                if (plVar5 == (lysc_node *)0x0) {
                  plVar4 = (lysc_node *)0x0;
                }
                else {
                  plVar4 = plVar5->parent;
                }
                plVar4 = lysc_data_node(plVar4);
                plVar6 = lys_getnext(plVar5,plVar4,(lysc_module *)0x0,getnext_opts);
              } while (plVar5 != (lysc_node *)0x0);
            }
            lVar13 = LYXP_NODE_ELEM;
            plVar7 = local_80;
            if (plVar6 == (lysc_node *)0x0) {
switchD_001b1ffc_caseD_3:
              plVar7 = local_80;
              plVar4 = iter;
              if (local_80 != (lys_module *)0x0) {
                plVar6 = lys_getnext(iter,(lysc_node *)0x0,local_80->compiled,getnext_opts);
                lVar13 = LYXP_NODE_ELEM;
                while (plVar6 == (lysc_node *)0x0) {
                  do {
                    plVar7 = ly_ctx_get_module_iter(set->ctx,&mod_idx);
                    if (plVar7 == (lys_module *)0x0) goto switchD_001b1ffc_caseD_8;
                  } while (plVar7->compiled == (lysc_module *)0x0);
                  iter = (lysc_node *)0x0;
                  if (plVar7 == (lys_module *)0x0) {
                    lVar13 = LYXP_NODE_NONE;
                    break;
                  }
                  plVar6 = lys_getnext((lysc_node *)0x0,(lysc_node *)0x0,plVar7->compiled,
                                       getnext_opts);
                }
                break;
              }
              if (iter == (lysc_node *)0x0) {
                plVar5 = (lysc_node *)0x0;
              }
              else {
                plVar5 = iter->parent;
              }
              plVar5 = lysc_data_node(plVar5);
              plVar6 = lys_getnext(plVar4,plVar5,iter->module->compiled,getnext_opts);
              if (plVar6 != (lysc_node *)0x0) {
                lVar13 = LYXP_NODE_ELEM;
                plVar7 = local_80;
                break;
              }
              if (scnode == (lysc_node *)0x0) {
                __assert_fail("scnode",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0x1a1b,
                              "LY_ERR moveto_axis_scnode_next(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                             );
              }
              if (((int)local_70 != 3) &&
                 (plVar4 = lysc_data_node(scnode->parent), plVar4 == (lysc_node *)0x0)) {
                while( true ) {
                  if (iter == (lysc_node *)0x0) {
                    plVar4 = (lysc_node *)0x0;
                  }
                  else {
                    plVar4 = iter->parent;
                  }
                  plVar4 = lysc_data_node(plVar4);
                  if (plVar4 == (lysc_node *)0x0) break;
                  if (iter == (lysc_node *)0x0) {
                    plVar4 = (lysc_node *)0x0;
                  }
                  else {
                    plVar4 = iter->parent;
                  }
                  iter = lysc_data_node(plVar4);
                }
                plVar6 = lys_getnext(iter,(lysc_node *)0x0,iter->module->compiled,getnext_opts);
                lVar13 = (uint)(plVar6 != (lysc_node *)0x0) * 3;
                plVar7 = local_80;
                break;
              }
              goto LAB_001b2346;
            }
            break;
          default:
            goto switchD_001b1ffc_caseD_8;
          case 9:
switchD_001b1ffc_caseD_9:
            plVar5 = (lysc_node *)0x0;
            do {
              plVar4 = plVar5;
              if (scnode == (lysc_node *)0x0) {
                plVar5 = (lysc_node *)0x0;
              }
              else {
                plVar5 = scnode->parent;
              }
              plVar5 = lysc_data_node(plVar5);
              plVar5 = lys_getnext(plVar4,plVar5,scnode->module->compiled,getnext_opts);
            } while ((plVar5 != (lysc_node *)0x0) && (plVar5 != scnode));
            if (plVar4 == (lysc_node *)0x0) {
              __assert_fail("dfs_stop",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0x19fa,
                            "LY_ERR moveto_axis_scnode_next(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                           );
            }
            if (iter != plVar4) goto switchD_001b1ffc_caseD_4;
            goto LAB_001b2346;
          case 10:
            if (iter == (lysc_node *)0x0) {
              __assert_fail("*iter",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0x1a3d,
                            "LY_ERR moveto_axis_scnode_next(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                           );
            }
            plVar4 = lysc_data_node(iter->parent);
            plVar4 = lys_getnext(plVar5,plVar4,iter->module->compiled,getnext_opts);
            plVar6 = (lysc_node *)0x0;
            if (plVar4 != scnode) {
              plVar6 = plVar4;
            }
            lVar13 = (uint)(plVar6 != (lysc_node *)0x0) * 3;
            plVar7 = local_80;
          }
          local_80 = plVar7;
          LVar2 = (uint)(lVar13 == LYXP_NODE_NONE) * 5;
          plVar4 = local_58;
          uVar14 = local_70;
          iter = plVar6;
          iter_type = lVar13;
LAB_001b23fd:
          if (LVar2 == LY_SUCCESS) {
            LVar2 = moveto_scnode_check(iter,(lysc_node *)0x0,set,local_40,local_48);
            if (LVar2 == LY_SUCCESS) {
              LVar2 = lyxp_set_scnode_insert_node(set,iter,iter_type,(lyxp_axis)uVar14,&idx);
              if (LVar2 != LY_SUCCESS) {
                return LY_EMEM;
              }
              uVar8 = (ulong)idx;
              if (local_60 < uVar8 && idx < (uint)local_68) {
                *(undefined4 *)((long)(set->val).nodes + uVar8 * 0x18 + 0xc) = 3;
                local_50 = CONCAT71((int7)(uVar8 * 3 >> 8),1);
              }
            }
            goto LAB_001b1fc6;
          }
          uVar8 = local_68;
          if ((local_85 != '\0') &&
             ((&((set->val).nodes)->type)[(long)plVar4 * 2] == LYXP_NODE_ELEM)) {
            local_58 = (lysc_node *)(&((set->val).nodes)->node)[(long)plVar4];
            __s = local_48->name;
            prefix_len = strlen(__s);
            name = local_40;
            name_len = strlen(local_40);
            LVar2 = ly_nested_ext_schema
                              ((lyd_node *)0x0,local_58,__s,prefix_len,LY_VALUE_JSON,(void *)0x0,
                               name,name_len,&iter,(lysc_ext_instance **)0x0);
            uVar8 = local_68;
            if (LVar2 == LY_SUCCESS) {
              LVar2 = lyxp_set_scnode_insert_node(set,iter,LYXP_NODE_ELEM,(lyxp_axis)uVar14,&idx);
              if (LVar2 != LY_SUCCESS) {
                return LY_EMEM;
              }
              uVar9 = (ulong)idx;
              uVar8 = local_68;
              if (local_60 < uVar9 && idx < (uint)local_68) {
                *(undefined4 *)((long)(set->val).nodes + uVar9 * 0x18 + 0xc) = 3;
                local_50 = CONCAT71((int7)(uVar9 * 3 >> 8),1);
              }
            }
          }
        }
        else if ((uint)uVar14 == 0xb) {
          iVar10 = 2;
          if ((*piVar3 == -2) || (*piVar3 == 2)) goto LAB_001b1faa;
        }
LAB_001b2502:
        local_60 = local_60 + 1;
      } while (local_60 != uVar8);
      bVar16 = (char)local_50 != '\0';
    }
    if (!bVar16 || uVar8 == 0) {
      return LY_SUCCESS;
    }
    lVar11 = 0;
    do {
      if (*(int *)((long)&((set->val).nodes)->pos + lVar11) == 3) {
        *(undefined4 *)((long)&((set->val).nodes)->pos + lVar11) = 2;
      }
      lVar11 = lVar11 + 0x18;
    } while (uVar8 * 0x18 != lVar11);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
moveto_scnode(struct lyxp_set *set, const struct lys_module *moveto_mod, const char *ncname, enum lyxp_axis axis,
        uint32_t options)
{
    ly_bool temp_ctx = 0;
    uint32_t getnext_opts, orig_used, i, mod_idx, idx;
    const struct lys_module *mod = NULL;
    const struct lysc_node *iter;
    enum lyxp_node_type iter_type;

    if (options & LYXP_SKIP_EXPR) {
        return LY_SUCCESS;
    }

    if (set->type != LYXP_SET_SCNODE_SET) {
        LOGVAL(set->ctx, LY_VCODE_XP_INOP_1, "path operator", print_set_type(set));
        return LY_EVALID;
    }

    /* getnext opts */
    getnext_opts = 0;
    if (options & LYXP_SCNODE_OUTPUT) {
        getnext_opts |= LYS_GETNEXT_OUTPUT;
    }
    if (options & LYXP_SCNODE_SCHEMAMOUNT) {
        getnext_opts |= LYS_GETNEXT_WITHSCHEMAMOUNT;
    }

    orig_used = set->used;
    for (i = 0; i < orig_used; ++i) {
        /* update in_ctx first */
        if (moveto_axis_scnode_next_in_ctx(&set->val.scnodes[i].in_ctx, axis)) {
            /* not usable, skip */
            continue;
        }

        iter = NULL;
        iter_type = 0;
        while (!moveto_axis_scnode_next(&iter, &iter_type, &mod, &mod_idx, set->val.scnodes[i].scnode,
                set->val.scnodes[i].type, axis, set, getnext_opts)) {
            if (moveto_scnode_check(iter, NULL, set, ncname, moveto_mod)) {
                continue;
            }

            /* insert */
            LY_CHECK_RET(lyxp_set_scnode_insert_node(set, iter, iter_type, axis, &idx));

            /* we need to prevent these nodes from being considered in this moveto */
            if ((idx < orig_used) && (idx > i)) {
                set->val.scnodes[idx].in_ctx = LYXP_SET_SCNODE_ATOM_NEW_CTX;
                temp_ctx = 1;
            }
        }

        if (moveto_mod && ncname && ((axis == LYXP_AXIS_DESCENDANT) || (axis == LYXP_AXIS_CHILD)) &&
                (set->val.scnodes[i].type == LYXP_NODE_ELEM) && !ly_nested_ext_schema(NULL, set->val.scnodes[i].scnode,
                moveto_mod->name, strlen(moveto_mod->name), LY_VALUE_JSON, NULL, ncname, strlen(ncname), &iter, NULL)) {
            /* there is a matching node from an extension, use it */
            LY_CHECK_RET(lyxp_set_scnode_insert_node(set, iter, LYXP_NODE_ELEM, axis, &idx));
            if ((idx < orig_used) && (idx > i)) {
                set->val.scnodes[idx].in_ctx = LYXP_SET_SCNODE_ATOM_NEW_CTX;
                temp_ctx = 1;
            }
        }
    }

    /* correct temporary in_ctx values */
    if (temp_ctx) {
        for (i = 0; i < orig_used; ++i) {
            if (set->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_NEW_CTX) {
                set->val.scnodes[i].in_ctx = LYXP_SET_SCNODE_ATOM_CTX;
            }
        }
    }

    return LY_SUCCESS;
}